

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int sasl_init_set_mechanism(SASL_INIT_HANDLE sasl_init,char *mechanism_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  SASL_INIT_INSTANCE *sasl_init_instance;
  
  if (sasl_init == (SASL_INIT_HANDLE)0x0) {
    iVar2 = 0x2a11;
  }
  else {
    item_value = amqpvalue_create_symbol(mechanism_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x2a19;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_init->composite_value,0,item_value);
      iVar2 = 0x2a1f;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int sasl_init_set_mechanism(SASL_INIT_HANDLE sasl_init, const char* mechanism_value)
{
    int result;

    if (sasl_init == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)sasl_init;
        AMQP_VALUE mechanism_amqp_value = amqpvalue_create_symbol(mechanism_value);
        if (mechanism_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_init_instance->composite_value, 0, mechanism_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(mechanism_amqp_value);
        }
    }

    return result;
}